

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_CPS(DisasContext_conflict1 *s,arg_CPS *a)

{
  uint uVar1;
  uint uVar2;
  uint32_t val;
  uint uVar3;
  
  uVar3 = (uint)s->features & 0x208;
  if ((uVar3 == 8) && (s->user == 0)) {
    uVar1 = 0;
    val = 0;
    if ((a->imod & 2U) != 0) {
      uVar1 = (uint)(a->A != 0) * 0x100;
      uVar2 = uVar1 + 0x80;
      if (a->I == 0) {
        uVar2 = uVar1;
      }
      uVar1 = uVar2 + 0x40;
      if (a->F == 0) {
        uVar1 = uVar2;
      }
      val = -(a->imod & 1U) & uVar1;
    }
    if (a->M != 0) {
      uVar1 = uVar1 | 0x1f;
      val = val | a->mode;
    }
    if (uVar1 != 0) {
      gen_set_psr_im(s,uVar1,0,val);
    }
  }
  return uVar3 == 8;
}

Assistant:

static bool trans_CPS(DisasContext *s, arg_CPS *a)
{
    uint32_t mask, val;

    if (!ENABLE_ARCH_6 || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (IS_USER(s)) {
        /* Implemented as NOP in user mode.  */
        return true;
    }
    /* TODO: There are quite a lot of UNPREDICTABLE argument combinations. */

    mask = val = 0;
    if (a->imod & 2) {
        if (a->A) {
            mask |= CPSR_A;
        }
        if (a->I) {
            mask |= CPSR_I;
        }
        if (a->F) {
            mask |= CPSR_F;
        }
        if (a->imod & 1) {
            val |= mask;
        }
    }
    if (a->M) {
        mask |= CPSR_M;
        val |= a->mode;
    }
    if (mask) {
        gen_set_psr_im(s, mask, 0, val);
    }
    return true;
}